

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3VdbeDeleteAuxData(VdbeFunc *pVdbeFunc,int mask)

{
  int iVar1;
  ulong uVar2;
  AuxData *pAVar3;
  
  iVar1 = pVdbeFunc->nAux;
  if (0 < iVar1) {
    pAVar3 = pVdbeFunc->apAux;
    uVar2 = 0;
    do {
      if (((0x1f < uVar2) || (((uint)mask >> ((uint)uVar2 & 0x1f) & 1) == 0)) &&
         (pAVar3->pAux != (void *)0x0)) {
        if (pAVar3->xDelete != (_func_void_void_ptr *)0x0) {
          (*pAVar3->xDelete)(pAVar3->pAux);
          iVar1 = pVdbeFunc->nAux;
        }
        pAVar3->pAux = (void *)0x0;
      }
      uVar2 = uVar2 + 1;
      pAVar3 = pAVar3 + 1;
    } while ((long)uVar2 < (long)iVar1);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeDeleteAuxData(VdbeFunc *pVdbeFunc, int mask){
  int i;
  for(i=0; i<pVdbeFunc->nAux; i++){
    struct AuxData *pAux = &pVdbeFunc->apAux[i];
    if( (i>31 || !(mask&(((u32)1)<<i))) && pAux->pAux ){
      if( pAux->xDelete ){
        pAux->xDelete(pAux->pAux);
      }
      pAux->pAux = 0;
    }
  }
}